

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

uint64_t __thiscall slang::ast::Type::getBitstreamWidth(Type *this)

{
  bitwidth_t bVar1;
  Type *this_00;
  FixedSizeUnpackedArrayType *pFVar2;
  UnpackedStructType *pUVar3;
  UnpackedUnionType *pUVar4;
  ClassType *this_01;
  Type *ct;
  Type *in_stack_ffffffffffffffe0;
  uint64_t local_8;
  
  this_00 = getCanonicalType(in_stack_ffffffffffffffe0);
  this_01 = (ClassType *)(ulong)((this_00->super_Symbol).kind - FixedSizeUnpackedArrayType);
  switch(this_01) {
  case (ClassType *)0x0:
    pFVar2 = Symbol::as<slang::ast::FixedSizeUnpackedArrayType>((Symbol *)0x81e98d);
    local_8 = pFVar2->bitstreamWidth;
    break;
  default:
    bVar1 = getBitWidth(this_00);
    local_8 = (uint64_t)bVar1;
    break;
  case (ClassType *)0x6:
    pUVar3 = Symbol::as<slang::ast::UnpackedStructType>((Symbol *)0x81e9a2);
    local_8 = pUVar3->bitstreamWidth;
    break;
  case (ClassType *)0x8:
    pUVar4 = Symbol::as<slang::ast::UnpackedUnionType>((Symbol *)0x81e9ba);
    local_8 = pUVar4->bitstreamWidth;
    break;
  case (ClassType *)0x9:
    Symbol::as<slang::ast::ClassType>((Symbol *)0x81e9d2);
    local_8 = ClassType::getBitstreamWidth(this_01);
  }
  return local_8;
}

Assistant:

uint64_t Type::getBitstreamWidth() const {
    auto& ct = getCanonicalType();
    switch (ct.kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
            return ct.as<FixedSizeUnpackedArrayType>().bitstreamWidth;
        case SymbolKind::UnpackedStructType:
            return ct.as<UnpackedStructType>().bitstreamWidth;
        case SymbolKind::UnpackedUnionType:
            return ct.as<UnpackedUnionType>().bitstreamWidth;
        case SymbolKind::ClassType:
            return ct.as<ClassType>().getBitstreamWidth();
        default:
            return ct.getBitWidth();
    }
}